

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

bool google::protobuf::compiler::php::IsReservedName(string_view name)

{
  bool bVar1;
  char *in_RCX;
  string_view s;
  int local_54;
  int i;
  undefined1 local_40 [8];
  string lower;
  string_view name_local;
  
  lower.field_2._8_8_ = name._M_len;
  s._M_str = in_RCX;
  s._M_len = (size_t)name._M_str;
  absl::lts_20250127::AsciiStrToLower_abi_cxx11_
            ((string *)local_40,(lts_20250127 *)lower.field_2._8_8_,s);
  local_54 = 0;
  do {
    if (0x4f < local_54) {
      name_local._M_str._7_1_ = false;
LAB_018138d0:
      std::__cxx11::string::~string((string *)local_40);
      return name_local._M_str._7_1_;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,kReservedNames[local_54]);
    if (bVar1) {
      name_local._M_str._7_1_ = true;
      goto LAB_018138d0;
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

bool IsReservedName(absl::string_view name) {
  std::string lower = absl::AsciiStrToLower(name);
  for (int i = 0; i < kReservedNamesSize; i++) {
    if (lower == kReservedNames[i]) {
      return true;
    }
  }
  return false;
}